

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O3

void __thiscall pstore::exchange::export_ns::ostringstream::~ostringstream(ostringstream *this)

{
  ~ostringstream(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~ostringstream () noexcept override = default;